

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O0

void Gia_ResbInit(Gia_ResbMan_t *p,Vec_Ptr_t *vDivs,int nWords,int nLimit,int nDivsMax,int iChoice,
                 int fUseXor,int fDebug,int fVerbose,int fVeryVerbose)

{
  word *pwVar1;
  word *pwVar2;
  int iChoice_local;
  int nDivsMax_local;
  int nLimit_local;
  int nWords_local;
  Vec_Ptr_t *vDivs_local;
  Gia_ResbMan_t *p_local;
  
  if (p->nWords == nWords) {
    p->nLimit = nLimit;
    p->nDivsMax = nDivsMax;
    p->iChoice = iChoice;
    p->fUseXor = fUseXor;
    p->fDebug = fDebug;
    p->fVerbose = fVerbose;
    p->fVeryVerbose = fVeryVerbose;
    pwVar1 = p->pSets[0];
    pwVar2 = (word *)Vec_PtrEntry(vDivs,0);
    Abc_TtCopy(pwVar1,pwVar2,nWords,0);
    pwVar1 = p->pSets[1];
    pwVar2 = (word *)Vec_PtrEntry(vDivs,1);
    Abc_TtCopy(pwVar1,pwVar2,nWords,0);
    Vec_PtrClear(p->vDivs);
    Vec_PtrAppend(p->vDivs,vDivs);
    Vec_IntClear(p->vGates);
    Vec_IntClear(p->vUnateLits[0]);
    Vec_IntClear(p->vUnateLits[1]);
    Vec_IntClear(p->vNotUnateVars[0]);
    Vec_IntClear(p->vNotUnateVars[1]);
    Vec_IntClear(p->vUnatePairs[0]);
    Vec_IntClear(p->vUnatePairs[1]);
    Vec_IntClear(p->vUnateLitsW[0]);
    Vec_IntClear(p->vUnateLitsW[1]);
    Vec_IntClear(p->vUnatePairsW[0]);
    Vec_IntClear(p->vUnatePairsW[1]);
    Vec_IntClear(p->vBinateVars);
    return;
  }
  __assert_fail("p->nWords == nWords",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaResub.c"
                ,0x154,
                "void Gia_ResbInit(Gia_ResbMan_t *, Vec_Ptr_t *, int, int, int, int, int, int, int, int)"
               );
}

Assistant:

void Gia_ResbInit( Gia_ResbMan_t * p, Vec_Ptr_t * vDivs, int nWords, int nLimit, int nDivsMax, int iChoice, int fUseXor, int fDebug, int fVerbose, int fVeryVerbose )
{
    assert( p->nWords == nWords );
    p->nLimit       = nLimit;
    p->nDivsMax     = nDivsMax;
    p->iChoice      = iChoice;
    p->fUseXor      = fUseXor;
    p->fDebug       = fDebug;
    p->fVerbose     = fVerbose;
    p->fVeryVerbose = fVeryVerbose;
    Abc_TtCopy( p->pSets[0], (word *)Vec_PtrEntry(vDivs, 0), nWords, 0 );
    Abc_TtCopy( p->pSets[1], (word *)Vec_PtrEntry(vDivs, 1), nWords, 0 );
    Vec_PtrClear( p->vDivs );
    Vec_PtrAppend( p->vDivs, vDivs );
    Vec_IntClear( p->vGates );
    Vec_IntClear( p->vUnateLits[0]    );
    Vec_IntClear( p->vUnateLits[1]    );
    Vec_IntClear( p->vNotUnateVars[0] );
    Vec_IntClear( p->vNotUnateVars[1] );
    Vec_IntClear( p->vUnatePairs[0]   );
    Vec_IntClear( p->vUnatePairs[1]   );
    Vec_IntClear( p->vUnateLitsW[0]   );
    Vec_IntClear( p->vUnateLitsW[1]   );
    Vec_IntClear( p->vUnatePairsW[0]  );
    Vec_IntClear( p->vUnatePairsW[1]  );
    Vec_IntClear( p->vBinateVars      );
}